

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_function.hpp
# Opt level: O0

double __thiscall sisl::function::eval(function *this,double d0,...)

{
  Scalar SVar1;
  char in_AL;
  Scalar *pSVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Scalar *local_158;
  Scalar local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_60;
  int i;
  undefined1 local_50 [8];
  vector p;
  int n;
  va_list args;
  double d0_local;
  function *this_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_118[1] = (Scalar)in_RSI;
  local_118[2] = (Scalar)in_RDX;
  local_118[3] = (Scalar)in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (*this->_vptr_function[0xc])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_50,
             (int *)((long)&p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_50,0);
  *pSVar2 = d0;
  args[0]._0_8_ = &stack0x00000008;
  n = 0x40;
  for (local_60 = 1;
      local_60 <
      p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_;
      local_60 = local_60 + 1) {
    if ((uint)n < 0xa1) {
      local_158 = (Scalar *)((long)local_118 + (long)n);
      n = n + 0x10;
    }
    else {
      local_158 = (Scalar *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    SVar1 = *local_158;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_50,
                        (long)local_60);
    *pSVar2 = SVar1;
  }
  (*this->_vptr_function[3])(this,local_50);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_50);
  return extraout_XMM0_Qa;
}

Assistant:

virtual const double eval(double d0, ...) {
        	va_list args;  
        	int n = this->dim();
        	vector p(n);

        	p[0] = d0;
			va_start(args, d0);  
        	for(int i = 1; i < n; i++) {
        		p[i] = va_arg (args, double);
        	}
        	va_end (args);
        	return this->operator()(p);
        }